

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O3

void __thiscall spvtools::opt::Function::Dump(Function *this)

{
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> this_00;
  ostream *str;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Function #",10);
  this_00._M_head_impl =
       (this->def_inst_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
       .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if ((this_00._M_head_impl)->has_result_id_ == true) {
    Instruction::GetSingleWordOperand
              (this_00._M_head_impl,(uint)(this_00._M_head_impl)->has_type_id_);
  }
  str = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(str,"\n",1);
  opt::operator<<(str,this);
  std::__ostream_insert<char,std::char_traits<char>>(str,"\n",1);
  return;
}

Assistant:

void Function::Dump() const {
  std::cerr << "Function #" << result_id() << "\n" << *this << "\n";
}